

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  byte *pbVar4;
  float fVar5;
  RayQueryContext *pRVar6;
  int iVar7;
  undefined1 *puVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  RayQueryContext *pRVar21;
  ulong uVar22;
  Scene *pSVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar52;
  float fVar53;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar67;
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  float fVar72;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined4 uVar85;
  float fVar86;
  undefined4 uVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  uint uVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_11b8;
  int local_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [16];
  long local_1170;
  long local_1168;
  ulong local_1160;
  ulong local_1158;
  byte *local_1150;
  RayHit *local_1148;
  long local_1140;
  int *local_1138;
  byte *local_1130;
  uint *local_1128;
  Intersectors *local_1120;
  undefined4 *local_1118;
  undefined4 local_1110;
  undefined4 local_1108;
  undefined4 local_1104;
  float local_1100;
  float local_10fc;
  float local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  float local_10d8;
  uint uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  ulong uVar11;
  
  if (*(Scene **)(*(long *)this + 0x70) != (Scene *)0x8) {
    local_1148 = ray;
    pRVar21 = (RayQueryContext *)(local_f78 + 0x10);
    local_f78._0_8_ = *(Scene **)(*(long *)this + 0x70);
    local_f78._8_4_ = 0;
    fVar69 = *(float *)&This->ptr;
    fVar72 = *(float *)((long)&This->ptr + 4);
    fVar100 = *(float *)&This->leafIntersector;
    fVar84 = *(float *)((long)&This->leafIntersector + 4);
    fVar103 = *(float *)&(This->collider).collide;
    fVar43 = *(float *)((long)&(This->collider).collide + 4);
    fVar52 = *(float *)&(This->collider).name;
    fVar53 = *(float *)((long)&(This->collider).name + 4);
    fVar54 = 0.0;
    if (0.0 <= fVar84) {
      fVar54 = fVar84;
    }
    fVar84 = *(float *)&(This->intersector1).intersect;
    fVar86 = 0.0;
    if (0.0 <= fVar84) {
      fVar86 = fVar84;
    }
    uVar25 = -(uint)((float)DAT_01f4bd50 <= ABS(fVar103));
    uVar26 = -(uint)(DAT_01f4bd50._4_4_ <= ABS(fVar43));
    uVar27 = -(uint)(DAT_01f4bd50._8_4_ <= ABS(fVar52));
    uVar28 = -(uint)(DAT_01f4bd50._12_4_ <= ABS(fVar53));
    auVar34._0_4_ = (uint)fVar103 & uVar25;
    auVar34._4_4_ = (uint)fVar43 & uVar26;
    auVar34._8_4_ = (uint)fVar52 & uVar27;
    auVar34._12_4_ = (uint)fVar53 & uVar28;
    auVar55._0_4_ = ~uVar25 & (uint)(float)DAT_01f4bd50;
    auVar55._4_4_ = ~uVar26 & (uint)DAT_01f4bd50._4_4_;
    auVar55._8_4_ = ~uVar27 & (uint)DAT_01f4bd50._8_4_;
    auVar55._12_4_ = ~uVar28 & (uint)DAT_01f4bd50._12_4_;
    auVar55 = auVar55 | auVar34;
    auVar44 = rcpps(auVar34,auVar55);
    fVar88 = auVar44._0_4_;
    fVar90 = auVar44._4_4_;
    fVar93 = auVar44._8_4_;
    fVar88 = (1.0 - auVar55._0_4_ * fVar88) * fVar88 + fVar88;
    fVar90 = (1.0 - auVar55._4_4_ * fVar90) * fVar90 + fVar90;
    fVar93 = (1.0 - auVar55._8_4_ * fVar93) * fVar93 + fVar93;
    uVar20 = (ulong)(fVar88 < 0.0) << 4;
    uVar18 = (ulong)(fVar90 < 0.0) << 4 | 0x20;
    uVar14 = (ulong)(fVar93 < 0.0) << 4 | 0x40;
    uVar22 = uVar20 ^ 0x10;
    uVar15 = uVar18 ^ 0x10;
    auVar44._4_4_ = fVar86;
    auVar44._0_4_ = fVar86;
    auVar44._8_4_ = fVar86;
    auVar44._12_4_ = fVar86;
    puVar8 = mm_lookupmask_ps;
    _local_ff8 = mm_lookupmask_ps._240_8_;
    _uStack_ff0 = mm_lookupmask_ps._248_8_;
    local_f88 = fVar100;
    fStack_f84 = fVar100;
    fStack_f80 = fVar100;
    fStack_f7c = fVar100;
    local_f98 = fVar54;
    fStack_f94 = fVar54;
    fStack_f90 = fVar54;
    fStack_f8c = fVar54;
    local_fa8 = fVar93;
    fStack_fa4 = fVar93;
    fStack_fa0 = fVar93;
    fStack_f9c = fVar93;
    local_fb8 = fVar69;
    fStack_fb4 = fVar69;
    fStack_fb0 = fVar69;
    fStack_fac = fVar69;
    local_fc8 = fVar72;
    fStack_fc4 = fVar72;
    fStack_fc0 = fVar72;
    fStack_fbc = fVar72;
    local_fd8 = fVar88;
    fStack_fd4 = fVar88;
    fStack_fd0 = fVar88;
    fStack_fcc = fVar88;
    local_fe8 = fVar90;
    fStack_fe4 = fVar90;
    fStack_fe0 = fVar90;
    fStack_fdc = fVar90;
    fVar84 = fVar100;
    fVar103 = fVar100;
    fVar43 = fVar100;
    fVar52 = fVar54;
    fVar53 = fVar54;
    fVar86 = fVar54;
    fVar91 = fVar93;
    fVar94 = fVar93;
    fVar96 = fVar93;
    fVar98 = fVar69;
    fVar99 = fVar69;
    fVar101 = fVar69;
    fVar105 = fVar72;
    fVar107 = fVar72;
    fVar109 = fVar72;
    fVar110 = fVar88;
    fVar83 = fVar88;
    fVar114 = fVar88;
    fVar117 = fVar90;
    fVar119 = fVar90;
    fVar121 = fVar90;
LAB_0056acb5:
    if (pRVar21 != (RayQueryContext *)local_f78) {
      pRVar6 = pRVar21 + -1;
      pRVar21 = (RayQueryContext *)&pRVar21[-1].user;
      if (*(float *)&pRVar6->args < *(float *)&(This->intersector1).intersect ||
          *(float *)&pRVar6->args == *(float *)&(This->intersector1).intersect) {
        pSVar23 = *(Scene **)pRVar21;
        while (((ulong)pSVar23 & 8) == 0) {
          pfVar2 = (float *)((long)&(pSVar23->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar20);
          auVar71._0_4_ = (*pfVar2 - fVar69) * fVar88;
          auVar71._4_4_ = (pfVar2[1] - fVar98) * fVar110;
          auVar71._8_4_ = (pfVar2[2] - fVar99) * fVar83;
          auVar71._12_4_ = (pfVar2[3] - fVar101) * fVar114;
          pfVar2 = (float *)((long)&(pSVar23->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar18);
          auVar45._0_4_ = (*pfVar2 - fVar72) * fVar90;
          auVar45._4_4_ = (pfVar2[1] - fVar105) * fVar117;
          auVar45._8_4_ = (pfVar2[2] - fVar107) * fVar119;
          auVar45._12_4_ = (pfVar2[3] - fVar109) * fVar121;
          auVar34 = maxps(auVar71,auVar45);
          pfVar2 = (float *)((long)&(pSVar23->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar14);
          auVar46._0_4_ = (*pfVar2 - fVar100) * fVar93;
          auVar46._4_4_ = (pfVar2[1] - fVar84) * fVar91;
          auVar46._8_4_ = (pfVar2[2] - fVar103) * fVar94;
          auVar46._12_4_ = (pfVar2[3] - fVar43) * fVar96;
          auVar59._4_4_ = fVar52;
          auVar59._0_4_ = fVar54;
          auVar59._8_4_ = fVar53;
          auVar59._12_4_ = fVar86;
          auVar55 = maxps(auVar46,auVar59);
          _local_10b8 = maxps(auVar34,auVar55);
          pfVar2 = (float *)((long)&(pSVar23->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar22);
          auVar47._0_4_ = (*pfVar2 - fVar69) * fVar88;
          auVar47._4_4_ = (pfVar2[1] - fVar98) * fVar110;
          auVar47._8_4_ = (pfVar2[2] - fVar99) * fVar83;
          auVar47._12_4_ = (pfVar2[3] - fVar101) * fVar114;
          pfVar2 = (float *)((long)&(pSVar23->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + uVar15);
          auVar56._0_4_ = (*pfVar2 - fVar72) * fVar90;
          auVar56._4_4_ = (pfVar2[1] - fVar105) * fVar117;
          auVar56._8_4_ = (pfVar2[2] - fVar107) * fVar119;
          auVar56._12_4_ = (pfVar2[3] - fVar109) * fVar121;
          auVar34 = minps(auVar47,auVar56);
          pfVar2 = (float *)((long)&(pSVar23->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper.field_0 + (uVar14 ^ 0x10));
          auVar57._0_4_ = (*pfVar2 - fVar100) * fVar93;
          auVar57._4_4_ = (pfVar2[1] - fVar84) * fVar91;
          auVar57._8_4_ = (pfVar2[2] - fVar103) * fVar94;
          auVar57._12_4_ = (pfVar2[3] - fVar43) * fVar96;
          auVar55 = minps(auVar57,auVar44);
          auVar34 = minps(auVar34,auVar55);
          auVar74._4_4_ = -(uint)(local_10b8._4_4_ <= auVar34._4_4_);
          auVar74._0_4_ = -(uint)(local_10b8._0_4_ <= auVar34._0_4_);
          auVar74._8_4_ = -(uint)(local_10b8._8_4_ <= auVar34._8_4_);
          auVar74._12_4_ = -(uint)(local_10b8._12_4_ <= auVar34._12_4_);
          uVar25 = movmskps((int)puVar8,auVar74);
          puVar8 = (undefined1 *)(ulong)uVar25;
          if (uVar25 == 0) goto LAB_0056acb5;
          uVar24 = (ulong)pSVar23 & 0xfffffffffffffff0;
          lVar17 = 0;
          if ((byte)uVar25 != 0) {
            for (; ((byte)uVar25 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          puVar8 = *(undefined1 **)(uVar24 + lVar17 * 8);
          uVar25 = (uVar25 & 0xff) - 1 & uVar25 & 0xff;
          context = pRVar21;
          pSVar23 = (Scene *)puVar8;
          if (uVar25 != 0) {
            uVar26 = *(uint *)(local_10b8 + lVar17 * 4);
            lVar17 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            pSVar23 = *(Scene **)(uVar24 + lVar17 * 8);
            uVar27 = *(uint *)(local_10b8 + lVar17 * 4);
            uVar25 = uVar25 - 1 & uVar25;
            if (uVar25 == 0) {
              context = (RayQueryContext *)&pRVar21->args;
              if (uVar26 < uVar27) {
                pRVar21->scene = pSVar23;
                *(uint *)&pRVar21->user = uVar27;
                pRVar21 = context;
                pSVar23 = (Scene *)puVar8;
              }
              else {
                pRVar21->scene = (Scene *)puVar8;
                *(uint *)&pRVar21->user = uVar26;
                puVar8 = (undefined1 *)pSVar23;
                pRVar21 = context;
              }
            }
            else {
              auVar35._8_4_ = uVar26;
              auVar35._0_8_ = puVar8;
              auVar35._12_4_ = 0;
              auVar48._8_4_ = uVar27;
              auVar48._0_8_ = pSVar23;
              auVar48._12_4_ = 0;
              lVar17 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              uVar11 = *(ulong *)(uVar24 + lVar17 * 8);
              iVar7 = *(int *)(local_10b8 + lVar17 * 4);
              auVar58._8_4_ = iVar7;
              auVar58._0_8_ = uVar11;
              auVar58._12_4_ = 0;
              auVar64._8_4_ = -(uint)((int)uVar26 < (int)uVar27);
              uVar25 = uVar25 - 1 & uVar25;
              if (uVar25 == 0) {
                auVar64._4_4_ = auVar64._8_4_;
                auVar64._0_4_ = auVar64._8_4_;
                auVar64._12_4_ = auVar64._8_4_;
                auVar34 = auVar35 & auVar64 | ~auVar64 & auVar48;
                auVar55 = auVar48 & auVar64 | ~auVar64 & auVar35;
                auVar65._8_4_ = -(uint)(auVar34._8_4_ < iVar7);
                auVar65._0_8_ = CONCAT44(auVar65._8_4_,auVar65._8_4_);
                auVar65._12_4_ = auVar65._8_4_;
                puVar8 = (undefined1 *)(~auVar65._0_8_ & uVar11 | auVar34._0_8_ & auVar65._0_8_);
                auVar59 = auVar58 & auVar65 | ~auVar65 & auVar34;
                auVar36._8_4_ = -(uint)(auVar55._8_4_ < auVar59._8_4_);
                auVar36._4_4_ = auVar36._8_4_;
                auVar36._0_4_ = auVar36._8_4_;
                auVar36._12_4_ = auVar36._8_4_;
                auVar34 = ~auVar36 & auVar55 | auVar59 & auVar36;
                pRVar21->scene = (Scene *)auVar34._0_8_;
                pRVar21->user = (RTCRayQueryContext *)auVar34._8_8_;
                *(undefined1 (*) [16])&pRVar21->args = auVar55 & auVar36 | ~auVar36 & auVar59;
                pRVar21 = (RayQueryContext *)&pRVar21[1].user;
                context = pRVar21;
                pSVar23 = (Scene *)puVar8;
              }
              else {
                lVar17 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                iVar3 = *(int *)(local_10b8 + lVar17 * 4);
                auVar70._8_4_ = iVar3;
                auVar70._0_8_ = *(undefined8 *)(uVar24 + lVar17 * 8);
                auVar70._12_4_ = 0;
                auVar66._4_4_ = auVar64._8_4_;
                auVar66._0_4_ = auVar64._8_4_;
                auVar66._8_4_ = auVar64._8_4_;
                auVar66._12_4_ = auVar64._8_4_;
                auVar34 = auVar35 & auVar66 | ~auVar66 & auVar48;
                auVar55 = auVar48 & auVar66 | ~auVar66 & auVar35;
                auVar73._0_4_ = -(uint)(iVar7 < iVar3);
                auVar73._4_4_ = -(uint)(iVar7 < iVar3);
                auVar73._8_4_ = -(uint)(iVar7 < iVar3);
                auVar73._12_4_ = -(uint)(iVar7 < iVar3);
                auVar59 = auVar58 & auVar73 | ~auVar73 & auVar70;
                auVar74 = ~auVar73 & auVar58 | auVar70 & auVar73;
                auVar60._8_4_ = -(uint)(auVar55._8_4_ < auVar74._8_4_);
                auVar60._4_4_ = auVar60._8_4_;
                auVar60._0_4_ = auVar60._8_4_;
                auVar60._12_4_ = auVar60._8_4_;
                auVar71 = auVar55 & auVar60 | ~auVar60 & auVar74;
                auVar55 = ~auVar60 & auVar55 | auVar74 & auVar60;
                auVar49._8_4_ = -(uint)(auVar34._8_4_ < auVar59._8_4_);
                auVar49._0_8_ = CONCAT44(auVar49._8_4_,auVar49._8_4_);
                auVar49._12_4_ = auVar49._8_4_;
                puVar8 = (undefined1 *)
                         (auVar34._0_8_ & auVar49._0_8_ | ~auVar49._0_8_ & auVar59._0_8_);
                auVar34 = ~auVar49 & auVar34 | auVar59 & auVar49;
                auVar37._8_4_ = -(uint)(auVar34._8_4_ < auVar71._8_4_);
                auVar37._4_4_ = auVar37._8_4_;
                auVar37._0_4_ = auVar37._8_4_;
                auVar37._12_4_ = auVar37._8_4_;
                auVar59 = auVar34 & auVar37 | ~auVar37 & auVar71;
                pRVar21->scene = (Scene *)auVar55._0_8_;
                pRVar21->user = (RTCRayQueryContext *)auVar55._8_8_;
                *(undefined1 (*) [16])&pRVar21->args = ~auVar37 & auVar34 | auVar71 & auVar37;
                pRVar21[1].user = (RTCRayQueryContext *)auVar59._0_8_;
                pRVar21[1].args = (RTCIntersectArguments *)auVar59._8_8_;
                pRVar21 = pRVar21 + 2;
                context = pRVar21;
                pSVar23 = (Scene *)puVar8;
              }
            }
          }
        }
        lVar17 = (ulong)((uint)pSVar23 & 0xf) - 8;
        uVar24 = (ulong)pSVar23 & 0xfffffffffffffff0;
        for (lVar19 = 0; lVar19 != lVar17; lVar19 = lVar19 + 1) {
          lVar16 = lVar19 * 0xb0;
          pfVar2 = (float *)(uVar24 + 0x80 + lVar16);
          fVar69 = *pfVar2;
          fVar72 = pfVar2[1];
          fVar100 = pfVar2[2];
          fVar84 = pfVar2[3];
          pfVar2 = (float *)(uVar24 + 0x40 + lVar16);
          fVar103 = *pfVar2;
          fVar43 = pfVar2[1];
          fVar52 = pfVar2[2];
          fVar53 = pfVar2[3];
          pfVar2 = (float *)(uVar24 + 0x70 + lVar16);
          fVar54 = *pfVar2;
          fVar86 = pfVar2[1];
          fVar93 = pfVar2[2];
          fVar91 = pfVar2[3];
          pfVar2 = (float *)(uVar24 + 0x50 + lVar16);
          fVar94 = *pfVar2;
          fVar96 = pfVar2[1];
          fVar98 = pfVar2[2];
          fVar99 = pfVar2[3];
          fVar116 = fVar54 * fVar94 - fVar69 * fVar103;
          fVar118 = fVar86 * fVar96 - fVar72 * fVar43;
          fVar120 = fVar93 * fVar98 - fVar100 * fVar52;
          fVar122 = fVar91 * fVar99 - fVar84 * fVar53;
          pfVar2 = (float *)(uVar24 + 0x60 + lVar16);
          fVar101 = *pfVar2;
          fVar105 = pfVar2[1];
          fVar107 = pfVar2[2];
          fVar109 = pfVar2[3];
          pfVar2 = (float *)(uVar24 + lVar16);
          pfVar1 = (float *)(uVar24 + 0x10 + lVar16);
          fStack_118c = *(float *)&This->ptr;
          fVar88 = *(float *)((long)&This->ptr + 4);
          fVar110 = *(float *)&This->leafIntersector;
          fVar83 = *(float *)&(This->collider).collide;
          fVar114 = *(float *)((long)&(This->collider).collide + 4);
          fVar90 = *(float *)&(This->collider).name;
          fVar33 = *pfVar2 - fStack_118c;
          fVar42 = pfVar2[1] - fStack_118c;
          fStack_1190 = pfVar2[2] - fStack_118c;
          fStack_118c = pfVar2[3] - fStack_118c;
          fVar63 = *pfVar1 - fVar88;
          fVar67 = pfVar1[1] - fVar88;
          fVar68 = pfVar1[2] - fVar88;
          fVar88 = pfVar1[3] - fVar88;
          fVar111 = fVar33 * fVar114 - fVar83 * fVar63;
          fVar112 = fVar42 * fVar114 - fVar83 * fVar67;
          fVar113 = fStack_1190 * fVar114 - fVar83 * fVar68;
          fVar115 = fStack_118c * fVar114 - fVar83 * fVar88;
          pfVar2 = (float *)(uVar24 + 0x30 + lVar16);
          fVar117 = *pfVar2;
          fVar119 = pfVar2[1];
          fVar121 = pfVar2[2];
          fVar5 = pfVar2[3];
          local_1018._0_4_ = fVar69 * fVar117 - fVar94 * fVar101;
          local_1018._4_4_ = fVar72 * fVar119 - fVar96 * fVar105;
          local_1018._8_4_ = fVar100 * fVar121 - fVar98 * fVar107;
          local_1018._12_4_ = fVar84 * fVar5 - fVar99 * fVar109;
          pfVar2 = (float *)(uVar24 + 0x20 + lVar16);
          fVar104 = *pfVar2 - fVar110;
          fVar106 = pfVar2[1] - fVar110;
          fVar108 = pfVar2[2] - fVar110;
          fVar110 = pfVar2[3] - fVar110;
          local_1198 = CONCAT44(fVar42,fVar33);
          fVar89 = fVar83 * fVar104 - fVar33 * fVar90;
          fVar92 = fVar83 * fVar106 - fVar42 * fVar90;
          fVar95 = fVar83 * fVar108 - fStack_1190 * fVar90;
          fVar97 = fVar83 * fVar110 - fStack_118c * fVar90;
          local_1008[0] = fVar103 * fVar101 - fVar54 * fVar117;
          local_1008[1] = fVar43 * fVar105 - fVar86 * fVar119;
          local_1008[2] = fVar52 * fVar107 - fVar93 * fVar121;
          local_1008[3] = fVar53 * fVar109 - fVar91 * fVar5;
          fVar76 = fVar90 * fVar63 - fVar114 * fVar104;
          fVar77 = fVar90 * fVar67 - fVar114 * fVar106;
          fVar78 = fVar90 * fVar68 - fVar114 * fVar108;
          fVar79 = fVar90 * fVar88 - fVar114 * fVar110;
          fVar80 = fVar114 * local_1018._0_4_ + fVar90 * local_1008[0] + fVar116 * fVar83;
          fVar81 = fVar114 * local_1018._4_4_ + fVar90 * local_1008[1] + fVar118 * fVar83;
          fVar82 = fVar114 * local_1018._8_4_ + fVar90 * local_1008[2] + fVar120 * fVar83;
          fVar83 = fVar114 * local_1018._12_4_ + fVar90 * local_1008[3] + fVar122 * fVar83;
          uVar26 = (uint)fVar80 & 0x80000000;
          uVar27 = (uint)fVar81 & 0x80000000;
          uVar28 = (uint)fVar82 & 0x80000000;
          uVar102 = (uint)fVar83 & 0x80000000;
          local_10b8._0_4_ = (uint)(fVar101 * fVar76 + fVar54 * fVar89 + fVar69 * fVar111) ^ uVar26;
          local_10b8._4_4_ = (uint)(fVar105 * fVar77 + fVar86 * fVar92 + fVar72 * fVar112) ^ uVar27;
          fStack_10b0 = (float)((uint)(fVar107 * fVar78 + fVar93 * fVar95 + fVar100 * fVar113) ^
                               uVar28);
          fStack_10ac = (float)((uint)(fVar109 * fVar79 + fVar91 * fVar97 + fVar84 * fVar115) ^
                               uVar102);
          local_10a8._0_4_ =
               (float)((uint)(fVar76 * fVar117 + fVar89 * fVar103 + fVar111 * fVar94) ^ uVar26);
          local_10a8._4_4_ =
               (float)((uint)(fVar77 * fVar119 + fVar92 * fVar43 + fVar112 * fVar96) ^ uVar27);
          local_10a8._8_4_ =
               (float)((uint)(fVar78 * fVar121 + fVar95 * fVar52 + fVar113 * fVar98) ^ uVar28);
          local_10a8._12_4_ =
               (float)((uint)(fVar79 * fVar5 + fVar97 * fVar53 + fVar115 * fVar99) ^ uVar102);
          fVar69 = ABS(fVar80);
          fVar72 = ABS(fVar81);
          local_1088._0_8_ = CONCAT44(fVar81,fVar80) & 0x7fffffff7fffffff;
          local_1088._8_4_ = ABS(fVar82);
          local_1088._12_4_ = ABS(fVar83);
          auVar75._0_4_ =
               -(uint)((float)local_10b8._0_4_ + local_10a8._0_4_ <= fVar69) &
               -(uint)((0.0 <= local_10a8._0_4_ && 0.0 <= (float)local_10b8._0_4_) && fVar80 != 0.0)
               & local_ff8;
          auVar75._4_4_ =
               -(uint)((float)local_10b8._4_4_ + local_10a8._4_4_ <= fVar72) &
               -(uint)((0.0 <= local_10a8._4_4_ && 0.0 <= (float)local_10b8._4_4_) && fVar81 != 0.0)
               & uStack_ff4;
          auVar75._8_4_ =
               -(uint)(fStack_10b0 + local_10a8._8_4_ <= local_1088._8_4_) &
               -(uint)((0.0 <= local_10a8._8_4_ && 0.0 <= fStack_10b0) && fVar82 != 0.0) &
               uStack_ff0;
          auVar75._12_4_ =
               -(uint)(fStack_10ac + local_10a8._12_4_ <= local_1088._12_4_) &
               -(uint)((0.0 <= local_10a8._12_4_ && 0.0 <= fStack_10ac) && fVar83 != 0.0) &
               uStack_fec;
          uVar25 = movmskps((int)puVar8,auVar75);
          puVar8 = (undefined1 *)(ulong)uVar25;
          if (uVar25 != 0) {
            local_1098 = (float)(uVar26 ^ (uint)(fVar33 * fVar116 +
                                                fVar63 * local_1018._0_4_ + fVar104 * local_1008[0])
                                );
            fStack_1094 = (float)(uVar27 ^ (uint)(fVar42 * fVar118 +
                                                 fVar67 * local_1018._4_4_ + fVar106 * local_1008[1]
                                                 ));
            fStack_1090 = (float)(uVar28 ^ (uint)(fStack_1190 * fVar120 +
                                                 fVar68 * local_1018._8_4_ + fVar108 * local_1008[2]
                                                 ));
            fStack_108c = (float)(uVar102 ^
                                 (uint)(fStack_118c * fVar122 +
                                       fVar88 * local_1018._12_4_ + fVar110 * local_1008[3]));
            fVar100 = *(float *)((long)&This->leafIntersector + 4);
            fVar84 = *(float *)&(This->intersector1).intersect;
            uVar26 = *(uint *)((long)&(This->intersector1).intersect + 4);
            uVar85 = *(undefined4 *)&(This->intersector1).occluded;
            uVar87 = *(undefined4 *)((long)&(This->intersector1).occluded + 4);
            auVar61._0_4_ =
                 -(uint)(local_1098 <= fVar84 * fVar69 && fVar100 * fVar69 < local_1098) &
                 auVar75._0_4_;
            auVar61._4_4_ =
                 -(uint)(fStack_1094 <= fVar84 * fVar72 && fVar100 * fVar72 < fStack_1094) &
                 auVar75._4_4_;
            auVar61._8_4_ =
                 -(uint)(fStack_1090 <= fVar84 * local_1088._8_4_ &&
                        fVar100 * local_1088._8_4_ < fStack_1090) & auVar75._8_4_;
            auVar61._12_4_ =
                 -(uint)(fStack_108c <= fVar84 * local_1088._12_4_ &&
                        fVar100 * local_1088._12_4_ < fStack_108c) & auVar75._12_4_;
            uVar25 = movmskps(uVar25,auVar61);
            puVar8 = (undefined1 *)(ulong)uVar25;
            if (uVar25 != 0) {
              local_1068 = auVar61;
              local_1028._4_4_ = fVar118;
              local_1028._0_4_ = fVar116;
              local_1028._8_4_ = fVar120;
              local_1028._12_4_ = fVar122;
              local_1140 = *(long *)&(local_1148->super_RayK<1>).org.field_0;
              local_1188 = auVar61;
              auVar44 = rcpps(local_1028,local_1088);
              fVar43 = auVar44._0_4_;
              fVar52 = auVar44._4_4_;
              fVar53 = auVar44._8_4_;
              fVar54 = auVar44._12_4_;
              fVar43 = (1.0 - fVar69 * fVar43) * fVar43 + fVar43;
              fVar52 = (1.0 - fVar72 * fVar52) * fVar52 + fVar52;
              fVar53 = (1.0 - local_1088._8_4_ * fVar53) * fVar53 + fVar53;
              fVar54 = (1.0 - local_1088._12_4_ * fVar54) * fVar54 + fVar54;
              fVar69 = local_1098 * fVar43;
              fVar72 = fStack_1094 * fVar52;
              fVar100 = fStack_1090 * fVar53;
              fVar103 = fStack_108c * fVar54;
              local_1038[0] = fVar69;
              local_1038[1] = fVar72;
              local_1038[2] = fVar100;
              local_1038[3] = fVar103;
              local_1058[0] = (float)local_10b8._0_4_ * fVar43;
              local_1058[1] = (float)local_10b8._4_4_ * fVar52;
              local_1058[2] = fStack_10b0 * fVar53;
              local_1058[3] = fStack_10ac * fVar54;
              local_1048[0] = fVar43 * local_10a8._0_4_;
              local_1048[1] = fVar52 * local_10a8._4_4_;
              local_1048[2] = fVar53 * local_10a8._8_4_;
              local_1048[3] = fVar54 * local_10a8._12_4_;
              auVar29._0_4_ = auVar61._0_4_ & (uint)fVar69;
              auVar29._4_4_ = auVar61._4_4_ & (uint)fVar72;
              auVar29._8_4_ = auVar61._8_4_ & (uint)fVar100;
              auVar29._12_4_ = auVar61._12_4_ & (uint)fVar103;
              auVar38._0_8_ = CONCAT44(~auVar61._4_4_,~auVar61._0_4_) & 0x7f8000007f800000;
              auVar38._8_4_ = ~auVar61._8_4_ & 0x7f800000;
              auVar38._12_4_ = ~auVar61._12_4_ & 0x7f800000;
              auVar38 = auVar38 | auVar29;
              auVar50._4_4_ = auVar38._0_4_;
              auVar50._0_4_ = auVar38._4_4_;
              auVar50._8_4_ = auVar38._12_4_;
              auVar50._12_4_ = auVar38._8_4_;
              auVar44 = minps(auVar50,auVar38);
              auVar30._0_8_ = auVar44._8_8_;
              auVar30._8_4_ = auVar44._0_4_;
              auVar30._12_4_ = auVar44._4_4_;
              auVar44 = minps(auVar30,auVar44);
              auVar31._0_8_ =
                   CONCAT44(-(uint)(auVar44._4_4_ == auVar38._4_4_) & auVar61._4_4_,
                            -(uint)(auVar44._0_4_ == auVar38._0_4_) & auVar61._0_4_);
              auVar31._8_4_ = -(uint)(auVar44._8_4_ == auVar38._8_4_) & auVar61._8_4_;
              auVar31._12_4_ = -(uint)(auVar44._12_4_ == auVar38._12_4_) & auVar61._12_4_;
              iVar7 = movmskps((int)local_1140,auVar31);
              if (iVar7 != 0) {
                auVar61._8_4_ = auVar31._8_4_;
                auVar61._0_8_ = auVar31._0_8_;
                auVar61._12_4_ = auVar31._12_4_;
              }
              uVar9 = movmskps((int)context,auVar61);
              uVar11 = CONCAT44((int)((ulong)context >> 0x20),uVar9);
              pbVar12 = (byte *)0x0;
              if (uVar11 != 0) {
                for (; (uVar11 >> (long)pbVar12 & 1) == 0; pbVar12 = pbVar12 + 1) {
                }
              }
              local_1198 = lVar16 + uVar24;
              local_11b8 = uVar26;
LAB_0056b31e:
              local_10f0 = *(uint *)(local_1198 + 0x90 + (long)pbVar12 * 4);
              pbVar4 = *(byte **)(*(long *)(local_1140 + 0x1e8) + (ulong)local_10f0 * 8);
              if ((*(uint *)(pbVar4 + 0x34) & local_11b8) == 0) {
                *(undefined4 *)(local_1188 + (long)pbVar12 * 4) = 0;
              }
              else {
                local_1150 = *(byte **)&(local_1148->super_RayK<1>).dir.field_0;
                if (*(long *)(local_1150 + 0x10) == 0) {
                  local_1128 = *(uint **)((long)&(local_1148->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(pbVar4 + 0x40) == 0) {
                    fVar69 = local_1058[(long)pbVar12];
                    fVar72 = local_1048[(long)pbVar12];
                    *(float *)&(This->intersector1).intersect = local_1038[(long)pbVar12];
                    *(undefined4 *)&(This->intersector1).pointQuery =
                         *(undefined4 *)(local_1028 + (long)pbVar12 * 4);
                    *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                         *(undefined4 *)(local_1018 + (long)pbVar12 * 4);
                    *(float *)&(This->intersector1).name = local_1008[(long)pbVar12];
                    *(float *)((long)&(This->intersector1).name + 4) = fVar69;
                    *(float *)&(This->intersector4).intersect = fVar72;
                    *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                         *(undefined4 *)(local_1198 + 0xa0 + (long)pbVar12 * 4);
                    *(uint *)&(This->intersector4).occluded = local_10f0;
                    context = (RayQueryContext *)(ulong)*local_1128;
                    *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1128;
                    puVar8 = (undefined1 *)(ulong)local_1128[1];
                    *(uint *)&(This->intersector4).name = local_1128[1];
                    goto LAB_0056b192;
                  }
                  local_10d8 = fVar84;
                  uStack_10d4 = uVar26;
                  uStack_10d0 = uVar85;
                  uStack_10cc = uVar87;
                  local_10c8 = fVar69;
                  fStack_10c4 = fVar72;
                  fStack_10c0 = fVar100;
                  fStack_10bc = fVar103;
                  local_1170 = lVar19;
                  local_1168 = lVar17;
                  local_1160 = uVar18;
                  local_1158 = uVar20;
                }
                else {
                  local_10d8 = fVar84;
                  uStack_10d4 = uVar26;
                  uStack_10d0 = uVar85;
                  uStack_10cc = uVar87;
                  local_10c8 = fVar69;
                  fStack_10c4 = fVar72;
                  fStack_10c0 = fVar100;
                  fStack_10bc = fVar103;
                  local_1170 = lVar19;
                  local_1168 = lVar17;
                  local_1160 = uVar18;
                  local_1158 = uVar20;
                  local_1128 = *(uint **)((long)&(local_1148->super_RayK<1>).org.field_0 + 8);
                }
                local_1108 = *(undefined4 *)(local_1028 + (long)pbVar12 * 4);
                local_1104 = *(undefined4 *)(local_1018 + (long)pbVar12 * 4);
                local_1100 = local_1008[(long)pbVar12];
                local_10fc = local_1058[(long)pbVar12];
                local_10f8 = local_1048[(long)pbVar12];
                local_10f4 = *(undefined4 *)(local_1198 + 0xa0 + (long)pbVar12 * 4);
                local_10ec = *local_1128;
                local_10e8 = local_1128[1];
                *(float *)&(This->intersector1).intersect = local_1038[(long)pbVar12];
                local_119c = -1;
                local_1138 = &local_119c;
                pbVar13 = *(byte **)(pbVar4 + 0x18);
                local_1130 = pbVar13;
                local_1120 = This;
                local_1118 = &local_1108;
                local_1110 = 1;
                local_1170 = lVar19;
                local_1168 = lVar17;
                local_1160 = uVar18;
                local_1158 = uVar20;
                local_10d8 = fVar84;
                uStack_10d4 = uVar26;
                uStack_10d0 = uVar85;
                uStack_10cc = uVar87;
                local_10c8 = fVar69;
                fStack_10c4 = fVar72;
                fStack_10c0 = fVar100;
                fStack_10bc = fVar103;
                if (((*(code **)(pbVar4 + 0x40) == (code *)0x0) ||
                    ((**(code **)(pbVar4 + 0x40))(&local_1138), *local_1138 != 0)) &&
                   ((*(code **)(local_1150 + 0x10) == (code *)0x0 ||
                    (((pbVar13 = local_1150, (*local_1150 & 2) == 0 &&
                      (pbVar13 = pbVar4, (pbVar4[0x3e] & 0x40) == 0)) ||
                     ((**(code **)(local_1150 + 0x10))(&local_1138), *local_1138 != 0)))))) {
                  *(undefined4 *)&(local_1120->intersector1).pointQuery = *local_1118;
                  *(undefined4 *)((long)&(local_1120->intersector1).pointQuery + 4) = local_1118[1];
                  *(undefined4 *)&(local_1120->intersector1).name = local_1118[2];
                  *(undefined4 *)((long)&(local_1120->intersector1).name + 4) = local_1118[3];
                  *(undefined4 *)&(local_1120->intersector4).intersect = local_1118[4];
                  *(undefined4 *)((long)&(local_1120->intersector4).intersect + 4) = local_1118[5];
                  *(undefined4 *)&(local_1120->intersector4).occluded = local_1118[6];
                  *(undefined4 *)((long)&(local_1120->intersector4).occluded + 4) = local_1118[7];
                  pbVar13 = (byte *)(ulong)(uint)local_1118[8];
                  *(undefined4 *)&(local_1120->intersector4).name = local_1118[8];
                }
                else {
                  *(float *)&(This->intersector1).intersect = local_10d8;
                }
                *(undefined4 *)(local_1188 + (long)pbVar12 * 4) = 0;
                fVar84 = *(float *)&(This->intersector1).intersect;
                uVar26 = *(uint *)((long)&(This->intersector1).intersect + 4);
                uVar85 = *(undefined4 *)&(This->intersector1).occluded;
                uVar87 = *(undefined4 *)((long)&(This->intersector1).occluded + 4);
                local_1188._0_4_ = -(uint)(local_10c8 <= fVar84) & local_1188._0_4_;
                local_1188._4_4_ = -(uint)(fStack_10c4 <= fVar84) & local_1188._4_4_;
                local_1188._8_4_ = -(uint)(fStack_10c0 <= fVar84) & local_1188._8_4_;
                local_1188._12_4_ = -(uint)(fStack_10bc <= fVar84) & local_1188._12_4_;
                local_11b8 = *(uint *)((long)&(This->intersector1).intersect + 4);
                pbVar12 = pbVar13;
                lVar17 = local_1168;
                uVar18 = local_1160;
                lVar19 = local_1170;
                uVar20 = local_1158;
                fVar69 = local_10c8;
                fVar72 = fStack_10c4;
                fVar100 = fStack_10c0;
                fVar103 = fStack_10bc;
              }
              puVar8 = (undefined1 *)(ulong)local_11b8;
              uVar9 = (undefined4)((ulong)pbVar12 >> 0x20);
              iVar7 = movmskps((int)pbVar12,local_1188);
              context = (RayQueryContext *)CONCAT44(uVar9,iVar7);
              if (iVar7 == 0) goto LAB_0056b192;
              uVar25 = local_1188._0_4_;
              uVar27 = local_1188._4_4_;
              uVar28 = local_1188._8_4_;
              uVar102 = local_1188._12_4_;
              auVar39._0_4_ = uVar25 & (uint)fVar69;
              auVar39._4_4_ = uVar27 & (uint)fVar72;
              auVar39._8_4_ = uVar28 & (uint)fVar100;
              auVar39._12_4_ = uVar102 & (uint)fVar103;
              auVar51._0_8_ = CONCAT44(~uVar27,~uVar25) & 0x7f8000007f800000;
              auVar51._8_4_ = ~uVar28 & 0x7f800000;
              auVar51._12_4_ = ~uVar102 & 0x7f800000;
              auVar51 = auVar51 | auVar39;
              auVar62._4_4_ = auVar51._0_4_;
              auVar62._0_4_ = auVar51._4_4_;
              auVar62._8_4_ = auVar51._12_4_;
              auVar62._12_4_ = auVar51._8_4_;
              auVar44 = minps(auVar62,auVar51);
              auVar40._0_8_ = auVar44._8_8_;
              auVar40._8_4_ = auVar44._0_4_;
              auVar40._12_4_ = auVar44._4_4_;
              auVar44 = minps(auVar40,auVar44);
              auVar41._0_8_ =
                   CONCAT44(-(uint)(auVar44._4_4_ == auVar51._4_4_) & uVar27,
                            -(uint)(auVar44._0_4_ == auVar51._0_4_) & uVar25);
              auVar41._8_4_ = -(uint)(auVar44._8_4_ == auVar51._8_4_) & uVar28;
              auVar41._12_4_ = -(uint)(auVar44._12_4_ == auVar51._12_4_) & uVar102;
              iVar7 = movmskps(iVar7,auVar41);
              auVar32 = local_1188;
              if (iVar7 != 0) {
                auVar32._8_4_ = auVar41._8_4_;
                auVar32._0_8_ = auVar41._0_8_;
                auVar32._12_4_ = auVar41._12_4_;
              }
              uVar10 = movmskps(iVar7,auVar32);
              uVar11 = CONCAT44(uVar9,uVar10);
              pbVar12 = (byte *)0x0;
              if (uVar11 != 0) {
                for (; (uVar11 >> (long)pbVar12 & 1) == 0; pbVar12 = pbVar12 + 1) {
                }
              }
              goto LAB_0056b31e;
            }
          }
LAB_0056b192:
          fVar100 = local_f88;
          fVar84 = fStack_f84;
          fVar103 = fStack_f80;
          fVar43 = fStack_f7c;
          fVar54 = local_f98;
          fVar52 = fStack_f94;
          fVar53 = fStack_f90;
          fVar86 = fStack_f8c;
          fVar93 = local_fa8;
          fVar91 = fStack_fa4;
          fVar94 = fStack_fa0;
          fVar96 = fStack_f9c;
          fVar69 = local_fb8;
          fVar98 = fStack_fb4;
          fVar99 = fStack_fb0;
          fVar101 = fStack_fac;
          fVar72 = local_fc8;
          fVar105 = fStack_fc4;
          fVar107 = fStack_fc0;
          fVar109 = fStack_fbc;
          fVar88 = local_fd8;
          fVar110 = fStack_fd4;
          fVar83 = fStack_fd0;
          fVar114 = fStack_fcc;
          fVar90 = local_fe8;
          fVar117 = fStack_fe4;
          fVar119 = fStack_fe0;
          fVar121 = fStack_fdc;
        }
        uVar85 = *(undefined4 *)&(This->intersector1).intersect;
        auVar44._4_4_ = uVar85;
        auVar44._0_4_ = uVar85;
        auVar44._8_4_ = uVar85;
        auVar44._12_4_ = uVar85;
      }
      goto LAB_0056acb5;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }